

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

float deqp::gles3::Functional::convertFloatFlushToZeroRtn
                (float value,int minExponent,int numAccurateBits)

{
  int iVar1;
  StorageType SVar2;
  Float<unsigned_int,_8,_23,_127,_3U> FVar3;
  uint uVar4;
  float fVar5;
  deUint32 u32;
  Float32 inputFloat;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  
  if ((value == 0.0) && (!NAN(value))) {
    return 0.0;
  }
  uVar4 = -1 << (0x17U - (char)numAccurateBits & 0x1f);
  inputFloat.m_value = (StorageType)value;
  if (value <= 0.0) {
    SVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(&inputFloat);
    if ((SVar2 & ~uVar4) != 0) {
      iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&inputFloat);
      SVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(&inputFloat);
      FVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(-1,iVar1,uVar4 & SVar2);
      iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&inputFloat);
      fVar5 = getSingleULPForExponent(iVar1,numAccurateBits);
      value = (float)FVar3.m_value - fVar5;
    }
  }
  else {
    local_24.m_value = (StorageType)value;
    iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_24);
    value = 0.0;
    if (minExponent <= iVar1) {
      iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&inputFloat);
      SVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(&inputFloat);
      value = (float)tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,iVar1,uVar4 & SVar2);
    }
  }
  return value;
}

Assistant:

static float convertFloatFlushToZeroRtn (float value, int minExponent, int numAccurateBits)
{
	if (value == 0.0f)
	{
		return 0.0f;
	}
	else
	{
		const tcu::Float32	inputFloat			= tcu::Float32(value);
		const int			numTruncatedBits	= 23-numAccurateBits;
		const deUint32		truncMask			= (1u<<numTruncatedBits)-1u;

		if (value > 0.0f)
		{
			if (value > 0.0f && tcu::Float32(value).exponent() < minExponent)
			{
				// flush to zero if possible
				return 0.0f;
			}
			else
			{
				// just mask away non-representable bits
				return tcu::Float32::construct(+1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat();
			}
		}
		else
		{
			if (inputFloat.mantissa() & truncMask)
			{
				// decrement one ulp if truncated bits are non-zero (i.e. if value is not representable)
				return tcu::Float32::construct(-1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat() - getSingleULPForExponent(inputFloat.exponent(), numAccurateBits);
			}
			else
			{
				// value is representable, no need to do anything
				return value;
			}
		}
	}
}